

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<unsigned_long_long>
          (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,unsigned_long_long value,format_specs *spec)

{
  undefined1 local_48 [8];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> w;
  format_specs *spec_local;
  unsigned_long_long value_local;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  
  w._32_8_ = spec;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::
  int_writer<unsigned_long_long>
            ((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *)local_48,
             (buffer_appender<char>)
             (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             (locale_ref)(this->locale_).locale_,value,spec);
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>&>
            (*(char *)(w._32_8_ + 8),
             (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *)local_48);
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)local_48;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }